

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall lzham::lzcompressor::put_bytes(lzcompressor *this,void *pBuf,uint buf_len)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *pBuf_00;
  uint in_EDX;
  long in_RSI;
  lzcompressor *in_RDI;
  uint num_bytes_to_copy;
  uint num_src_bytes_remaining;
  uint8 *pSrcBuf;
  bool status;
  uchar *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined1 grow_hint;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint buf_len_00;
  void *in_stack_ffffffffffffffc0;
  uint local_2c;
  bool local_1d;
  bool local_1;
  
  if ((in_RDI->m_finished & 1U) == 0) {
    local_1d = true;
    local_2c = in_EDX;
    if (in_RSI == 0) {
      uVar2 = vector<unsigned_char>::size(&in_RDI->m_block_buf);
      grow_hint = (undefined1)(in_stack_ffffffffffffffb0 >> 0x18);
      if (uVar2 != 0) {
        pBuf_00 = vector<unsigned_char>::get_ptr(&in_RDI->m_block_buf);
        vector<unsigned_char>::size(&in_RDI->m_block_buf);
        local_1d = compress_block(in_RDI,pBuf_00,in_stack_ffffffffffffffbc);
        vector<unsigned_char>::try_resize
                  ((vector<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   in_stack_ffffffffffffffb4,(bool)grow_hint);
      }
      if ((local_1d != false) &&
         (bVar1 = send_final_block((lzcompressor *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
         !bVar1)) {
        local_1d = false;
      }
      in_RDI->m_finished = true;
    }
    else {
      for (; local_2c != 0; local_2c = local_2c - uVar4) {
        uVar2 = (in_RDI->m_params).m_block_size;
        buf_len_00 = local_2c;
        uVar3 = vector<unsigned_char>::size(&in_RDI->m_block_buf);
        uVar4 = local_2c;
        if (uVar2 - uVar3 <= buf_len_00) {
          in_stack_ffffffffffffffb0 = (in_RDI->m_params).m_block_size;
          uVar4 = vector<unsigned_char>::size(&in_RDI->m_block_buf);
          uVar4 = in_stack_ffffffffffffffb0 - uVar4;
        }
        if (uVar4 == (in_RDI->m_params).m_block_size) {
          local_1d = compress_block(in_RDI,in_stack_ffffffffffffffc0,buf_len_00);
        }
        else {
          uVar3 = uVar4;
          bVar1 = vector<unsigned_char>::append
                            ((vector<unsigned_char> *)CONCAT44(buf_len_00,uVar2),
                             (uchar *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
                             (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
          if (!bVar1) {
            return false;
          }
          uVar5 = vector<unsigned_char>::size(&in_RDI->m_block_buf);
          if (uVar5 == (in_RDI->m_params).m_block_size) {
            in_stack_ffffffffffffffa8 = vector<unsigned_char>::get_ptr(&in_RDI->m_block_buf);
            vector<unsigned_char>::size(&in_RDI->m_block_buf);
            local_1d = compress_block(in_RDI,in_stack_ffffffffffffffc0,buf_len_00);
            vector<unsigned_char>::try_resize
                      ((vector<unsigned_char> *)CONCAT44(buf_len_00,uVar2),uVar3,
                       SUB41(in_stack_ffffffffffffffb0 >> 0x18,0));
          }
        }
        if (local_1d == false) {
          return false;
        }
      }
    }
    lzham_flush_buffered_printf();
    local_1 = local_1d;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool lzcompressor::put_bytes(const void* pBuf, uint buf_len)
   {
      LZHAM_ASSERT(!m_finished);
      if (m_finished)
      {
         LZHAM_LOG_ERROR(7024);
         return false;
      }

      bool status = true;

      if (!pBuf)
      {
         // Last block - flush whatever's left and send the final block.
         if (m_block_buf.size())
         {
            status = compress_block(m_block_buf.get_ptr(), m_block_buf.size());

            m_block_buf.try_resize(0);
         }

         if (status)
         {
            if (!send_final_block())
            {
               status = false;
               LZHAM_LOG_ERROR(7025);
            }
         }

         m_finished = true;
      }
      else
      {
         // Compress blocks.
         const uint8 *pSrcBuf = static_cast<const uint8*>(pBuf);
         uint num_src_bytes_remaining = buf_len;

         while (num_src_bytes_remaining)
         {
            const uint num_bytes_to_copy = LZHAM_MIN(num_src_bytes_remaining, m_params.m_block_size - m_block_buf.size());

            if (num_bytes_to_copy == m_params.m_block_size)
            {
               LZHAM_ASSERT(!m_block_buf.size());

               // Full-block available - compress in-place.
               status = compress_block(pSrcBuf, num_bytes_to_copy);
            }
            else
            {
               // Less than a full block available - append to already accumulated bytes.
               if (!m_block_buf.append(static_cast<const uint8 *>(pSrcBuf), num_bytes_to_copy))
               {
                  LZHAM_LOG_ERROR(7026);
                  return false;
               }

               LZHAM_ASSERT(m_block_buf.size() <= m_params.m_block_size);

               if (m_block_buf.size() == m_params.m_block_size)
               {
                  status = compress_block(m_block_buf.get_ptr(), m_block_buf.size());

                  m_block_buf.try_resize(0);
               }
            }

            if (!status)
            {
               LZHAM_LOG_ERROR(7027);
               return false;
            }

            pSrcBuf += num_bytes_to_copy;
            num_src_bytes_remaining -= num_bytes_to_copy;
         }
      }

      lzham_flush_buffered_printf();

      return status;
   }